

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void icu_63::UnicodeSet::_appendToPat(UnicodeString *buf,UnicodeString *s,UBool escapeUnprintable)

{
  int32_t iVar1;
  uint c;
  int iVar2;
  undefined4 local_24;
  int32_t i;
  UChar32 cp;
  UBool escapeUnprintable_local;
  UnicodeString *s_local;
  UnicodeString *buf_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = UnicodeString::length(s);
    if (iVar1 <= local_24) break;
    c = UnicodeString::char32At(s,local_24);
    _appendToPat(buf,c,escapeUnprintable);
    iVar2 = 2;
    if (c < 0x10000) {
      iVar2 = 1;
    }
    local_24 = iVar2 + local_24;
  }
  return;
}

Assistant:

void UnicodeSet::_appendToPat(UnicodeString& buf, const UnicodeString& s, UBool
escapeUnprintable) {
    UChar32 cp;
    for (int32_t i = 0; i < s.length(); i += U16_LENGTH(cp)) {
        _appendToPat(buf, cp = s.char32At(i), escapeUnprintable);
    }
}